

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestGroupUtil.hpp
# Opt level: O0

TestCaseGroup *
vkt::
createTestGroup<tcu::TestStatus(*)(vkt::Context&,vk::VkFormat,vk::VkImageType,vk::VkImageTiling)>
          (TestContext *testCtx,string *name,string *description,CreateChildrenFunc createChildren,
          _func_TestStatus_Context_ptr_VkFormat_VkImageType_VkImageTiling *arg0)

{
  TestGroupHelper1<tcu::TestStatus_(*)(vkt::Context_&,_vk::VkFormat,_vk::VkImageType,_vk::VkImageTiling)>
  *this;
  _func_TestStatus_Context_ptr_VkFormat_VkImageType_VkImageTiling *local_30;
  _func_TestStatus_Context_ptr_VkFormat_VkImageType_VkImageTiling *arg0_local;
  CreateChildrenFunc createChildren_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  
  local_30 = arg0;
  arg0_local = (_func_TestStatus_Context_ptr_VkFormat_VkImageType_VkImageTiling *)createChildren;
  createChildren_local = (CreateChildrenFunc)description;
  description_local = name;
  name_local = (string *)testCtx;
  this = (TestGroupHelper1<tcu::TestStatus_(*)(vkt::Context_&,_vk::VkFormat,_vk::VkImageType,_vk::VkImageTiling)>
          *)operator_new(0x80);
  TestGroupHelper1<tcu::TestStatus_(*)(vkt::Context_&,_vk::VkFormat,_vk::VkImageType,_vk::VkImageTiling)>
  ::TestGroupHelper1(this,(TestContext *)name_local,description_local,(string *)createChildren_local
                     ,(CreateChildrenFunc)arg0_local,&local_30);
  return &this->super_TestCaseGroup;
}

Assistant:

tcu::TestCaseGroup* createTestGroup (tcu::TestContext&										testCtx,
									 const std::string&										name,
									 const std::string&										description,
									 typename TestGroupHelper1<Arg0>::CreateChildrenFunc	createChildren,
									 Arg0													arg0)
{
	return new TestGroupHelper1<Arg0>(testCtx, name, description, createChildren, arg0);
}